

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

QueryParam *
kj::_::CopyConstructArray_<kj::Url::QueryParam,_kj::Url::QueryParam_*,_true,_false>::apply
          (QueryParam *pos,QueryParam *start,QueryParam *end)

{
  for (; start != end; start = start + 1) {
    Url::QueryParam::QueryParam(pos,start);
    pos = pos + 1;
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }